

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

void __thiscall rtosc::Ports::Ports(Ports *this,initializer_list<rtosc::Port> l)

{
  initializer_list<rtosc::Port> __l;
  size_type in_RDX;
  iterator in_RSI;
  long in_RDI;
  allocator_type *in_stack_ffffffffffffffc8;
  Ports *in_stack_ffffffffffffffd0;
  
  std::allocator<rtosc::Port>::allocator((allocator<rtosc::Port> *)0x1058fb);
  __l._M_len = in_RDX;
  __l._M_array = in_RSI;
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::vector
            (&in_stack_ffffffffffffffd0->ports,__l,in_stack_ffffffffffffffc8);
  std::allocator<rtosc::Port>::~allocator((allocator<rtosc::Port> *)0x105920);
  std::function<void_(const_char_*,_rtosc::RtData_&)>::function
            ((function<void_(const_char_*,_rtosc::RtData_&)> *)(in_RDI + 0x18));
  *(undefined8 *)(in_RDI + 0x38) = 0;
  refreshMagic(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Ports::Ports(std::initializer_list<Port> l)
    :ports(l), impl(NULL)
{
    refreshMagic();
}